

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_common_z5_operators<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
                *matrix)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_12;
  undefined8 uVar1;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  lazy_ostream *plVar5;
  basic_cstring<const_char> local_c18;
  basic_cstring<const_char> local_c08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_bf8;
  assertion_result local_bd8;
  basic_cstring<const_char> local_bc0;
  basic_cstring<const_char> local_bb0;
  basic_cstring<const_char> local_ba0;
  basic_cstring<const_char> local_b90;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b80;
  assertion_result local_b60;
  basic_cstring<const_char> local_b48;
  basic_cstring<const_char> local_b38;
  basic_cstring<const_char> local_b28;
  basic_cstring<const_char> local_b18;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_b08;
  assertion_result local_ae8;
  basic_cstring<const_char> local_ad0;
  basic_cstring<const_char> local_ac0;
  basic_cstring<const_char> local_ab0;
  basic_cstring<const_char> local_aa0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a90;
  assertion_result local_a70;
  basic_cstring<const_char> local_a58;
  basic_cstring<const_char> local_a48;
  basic_cstring<const_char> local_a38;
  basic_cstring<const_char> local_a28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_a18;
  assertion_result local_9f8;
  basic_cstring<const_char> local_9e0;
  basic_cstring<const_char> local_9d0;
  basic_cstring<const_char> local_9c0;
  basic_cstring<const_char> local_9b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_9a0;
  assertion_result local_980;
  basic_cstring<const_char> local_968;
  basic_cstring<const_char> local_958;
  uint local_948 [10];
  iterator local_920;
  undefined8 local_918;
  int local_910 [12];
  pair<unsigned_int,_unsigned_int> local_8e0;
  pair<unsigned_int,_unsigned_int> local_8d8;
  pair<unsigned_int,_unsigned_int> local_8d0;
  pair<unsigned_int,_unsigned_int> local_8c8;
  pair<unsigned_int,_unsigned_int> local_8c0;
  pair<unsigned_int,_unsigned_int> local_8b8;
  iterator local_8b0;
  undefined8 local_8a8;
  Field_element local_89c;
  uint local_898 [10];
  iterator local_870;
  undefined8 local_868;
  int local_860 [12];
  pair<unsigned_int,_unsigned_int> local_830;
  pair<unsigned_int,_unsigned_int> local_828;
  pair<unsigned_int,_unsigned_int> local_820;
  pair<unsigned_int,_unsigned_int> local_818;
  pair<unsigned_int,_unsigned_int> local_810;
  pair<unsigned_int,_unsigned_int> local_808;
  iterator local_800;
  undefined8 local_7f8;
  Field_element local_7ec;
  uint local_7e8 [10];
  iterator local_7c0;
  undefined8 local_7b8;
  int local_7b0 [10];
  pair<unsigned_int,_unsigned_int> local_788;
  pair<unsigned_int,_unsigned_int> local_780;
  pair<unsigned_int,_unsigned_int> local_778;
  pair<unsigned_int,_unsigned_int> local_770;
  pair<unsigned_int,_unsigned_int> local_768;
  iterator local_760;
  undefined8 local_758;
  Field_element local_74c;
  uint local_748 [8];
  iterator local_728;
  undefined8 local_720;
  int local_718 [10];
  pair<unsigned_int,_unsigned_int> local_6f0;
  pair<unsigned_int,_unsigned_int> local_6e8;
  pair<unsigned_int,_unsigned_int> local_6e0;
  pair<unsigned_int,_unsigned_int> local_6d8;
  pair<unsigned_int,_unsigned_int> local_6d0;
  iterator local_6c8;
  undefined8 local_6c0;
  Field_element local_6b4;
  basic_cstring<const_char> local_6b0;
  basic_cstring<const_char> local_6a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_690;
  assertion_result local_670;
  basic_cstring<const_char> local_658;
  basic_cstring<const_char> local_648;
  basic_cstring<const_char> local_638;
  basic_cstring<const_char> local_628;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_618;
  assertion_result local_5f8;
  basic_cstring<const_char> local_5e0;
  basic_cstring<const_char> local_5d0;
  basic_cstring<const_char> local_5c0;
  basic_cstring<const_char> local_5b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_5a0;
  assertion_result local_580;
  basic_cstring<const_char> local_568;
  basic_cstring<const_char> local_558;
  basic_cstring<const_char> local_548;
  basic_cstring<const_char> local_538;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_528;
  assertion_result local_508;
  basic_cstring<const_char> local_4f0;
  basic_cstring<const_char> local_4e0;
  basic_cstring<const_char> local_4d0;
  basic_cstring<const_char> local_4c0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_4b0;
  assertion_result local_490;
  basic_cstring<const_char> local_478;
  basic_cstring<const_char> local_468;
  uint local_458 [8];
  iterator local_438;
  undefined8 local_430;
  int local_428 [10];
  pair<unsigned_int,_unsigned_int> local_400;
  pair<unsigned_int,_unsigned_int> local_3f8;
  pair<unsigned_int,_unsigned_int> local_3f0;
  pair<unsigned_int,_unsigned_int> local_3e8;
  pair<unsigned_int,_unsigned_int> local_3e0;
  iterator local_3d8;
  undefined8 local_3d0;
  uint local_3c8 [10];
  iterator local_3a0;
  undefined8 local_398;
  int local_390 [8];
  pair<unsigned_int,_unsigned_int> local_370;
  pair<unsigned_int,_unsigned_int> local_368;
  pair<unsigned_int,_unsigned_int> local_360;
  pair<unsigned_int,_unsigned_int> local_358;
  iterator local_350;
  undefined8 local_348;
  basic_cstring<const_char> local_340;
  basic_cstring<const_char> local_330;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_320;
  assertion_result local_300;
  basic_cstring<const_char> local_2e8;
  basic_cstring<const_char> local_2d8;
  basic_cstring<const_char> local_2c8;
  basic_cstring<const_char> local_2b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2a8;
  assertion_result local_288;
  basic_cstring<const_char> local_270;
  basic_cstring<const_char> local_260;
  basic_cstring<const_char> local_250;
  basic_cstring<const_char> local_240;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_230;
  assertion_result local_210;
  basic_cstring<const_char> local_1f8;
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1b8;
  assertion_result local_198;
  basic_cstring<const_char> local_180;
  basic_cstring<const_char> local_170;
  basic_cstring<const_char> local_160;
  basic_cstring<const_char> local_150;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_140;
  assertion_result local_120;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  uint local_e8 [8];
  iterator local_c8;
  undefined8 local_c0;
  int local_b8 [8];
  pair<unsigned_int,_unsigned_int> local_98;
  pair<unsigned_int,_unsigned_int> local_90;
  pair<unsigned_int,_unsigned_int> local_88;
  pair<unsigned_int,_unsigned_int> local_80;
  iterator local_78;
  undefined8 local_70;
  undefined1 local_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  setcont;
  vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
  *matrix_local;
  
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::set((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
         *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,1);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::operator+=(pvVar4,pvVar3);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,2);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::operator+=(pvVar4,pvVar3);
  local_b8[7] = 1;
  local_b8[6] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_98,local_b8 + 7,local_b8 + 6);
  local_b8[5] = 2;
  local_b8[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_90,local_b8 + 5,local_b8 + 4);
  local_b8[3] = 3;
  local_b8[2] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_88,local_b8 + 3,local_b8 + 2);
  local_b8[1] = 6;
  local_b8[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_80,local_b8 + 1,local_b8);
  local_78 = &local_98;
  local_70 = 4;
  __l_12._M_len = 4;
  __l_12._M_array = local_78;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_12);
  local_e8[4] = 0;
  local_e8[5] = 0;
  local_e8[6] = 1;
  local_e8[0] = 0;
  local_e8[1] = 4;
  local_e8[2] = 1;
  local_e8[3] = 3;
  local_c8 = local_e8;
  local_c0 = 7;
  __l_11._M_len = 7;
  __l_11._M_array = local_c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_11);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0x17a,&local_108);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_120,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_150,"matrix[1] == matrix[1]",0x16);
    boost::unit_test::operator<<(&local_140,plVar5,&local_150);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_160,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_120,&local_140,&local_160,0x17a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_140);
    boost::test_tools::assertion_result::~assertion_result(&local_120);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_170,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_180);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_170,0x17b,&local_180);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_198,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,"matrix[1] == matrix[3]",0x16);
    boost::unit_test::operator<<(&local_1b8,plVar5,&local_1c8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_198,&local_1b8,&local_1d8,0x17b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1b8);
    boost::test_tools::assertion_result::~assertion_result(&local_198);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1f8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1e8,0x17c,&local_1f8);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_210,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,"matrix[1] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_230,plVar5,&local_240);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_250,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_210,&local_230,&local_250,0x17c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_230);
    boost::test_tools::assertion_result::~assertion_result(&local_210);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_260,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_270);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_260,0x180,&local_270);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_288,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b8,"matrix[2] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_2a8,plVar5,&local_2b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_288,&local_2a8,&local_2c8,0x180,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2a8);
    boost::test_tools::assertion_result::~assertion_result(&local_288);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2e8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2d8,0x182,&local_2e8);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_300,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_330,"!(matrix[0] < matrix[0])",0x18);
    boost::unit_test::operator<<(&local_320,plVar5,&local_330);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_300,&local_320,&local_340,0x182,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_320);
    boost::test_tools::assertion_result::~assertion_result(&local_300);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::operator*=(pvVar3,4);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,1);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::operator*=(pvVar3,2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,2);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::operator*=(pvVar3,1);
  local_390[7] = 1;
  local_390[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_370,local_390 + 7,local_390 + 6);
  local_390[5] = 2;
  local_390[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_368,local_390 + 5,local_390 + 4);
  local_390[3] = 3;
  local_390[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_360,local_390 + 3,local_390 + 2);
  local_390[1] = 6;
  local_390[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_358,local_390 + 1,local_390);
  local_350 = &local_370;
  local_348 = 4;
  __l_10._M_len = 4;
  __l_10._M_array = local_350;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_10);
  local_3c8[4] = 0;
  local_3c8[5] = 0;
  local_3c8[6] = 4;
  local_3c8[0] = 0;
  local_3c8[1] = 1;
  local_3c8[2] = 4;
  local_3c8[3] = 2;
  local_3a0 = local_3c8;
  local_398 = 7;
  __l_09._M_len = 7;
  __l_09._M_array = local_3a0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_09);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  local_428[9] = 0;
  local_428[8] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_400,local_428 + 9,local_428 + 8);
  local_428[7] = 1;
  local_428[6] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_3f8,local_428 + 7,local_428 + 6);
  local_428[5] = 2;
  local_428[4] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_3f0,local_428 + 5,local_428 + 4);
  local_428[3] = 5;
  local_428[2] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_3e8,local_428 + 3,local_428 + 2);
  local_428[1] = 6;
  local_428[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_3e0,local_428 + 1,local_428);
  local_3d8 = &local_400;
  local_3d0 = 5;
  __l_08._M_len = 5;
  __l_08._M_array = local_3d8;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_08);
  local_458[4] = 0;
  local_458[5] = 4;
  local_458[6] = 4;
  local_458[0] = 1;
  local_458[1] = 3;
  local_458[2] = 4;
  local_458[3] = 0;
  local_438 = local_458;
  local_430 = 7;
  __l_07._M_len = 7;
  __l_07._M_array = local_438;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_07);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,2);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_468,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_478);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_468,0x18e,&local_478);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_490,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4c0,"matrix[1] == matrix[1]",0x16);
    boost::unit_test::operator<<(&local_4b0,plVar5,&local_4c0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_490,&local_4b0,&local_4d0,0x18e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_4b0);
    boost::test_tools::assertion_result::~assertion_result(&local_490);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4e0,399,&local_4f0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_508,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_538,"matrix[1] == matrix[3]",0x16);
    boost::unit_test::operator<<(&local_528,plVar5,&local_538);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_548,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_508,&local_528,&local_548,399,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_528);
    boost::test_tools::assertion_result::~assertion_result(&local_508);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_558,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_568);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_558,400,&local_568);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,1);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_580,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b0,"matrix[1] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_5a0,plVar5,&local_5b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_580,&local_5a0,&local_5c0,400,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_5a0);
    boost::test_tools::assertion_result::~assertion_result(&local_580);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_5e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_5d0,0x194,&local_5e0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,2);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_5f8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_628,"matrix[2] < matrix[0]",0x15);
    boost::unit_test::operator<<(&local_618,plVar5,&local_628);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_638,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_5f8,&local_618,&local_638,0x194,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_618);
    boost::test_tools::assertion_result::~assertion_result(&local_5f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_648,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_658);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_648,0x196,&local_658);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,0);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_670,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6a0,"!(matrix[0] < matrix[0])",0x18);
    boost::unit_test::operator<<(&local_690,plVar5,&local_6a0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_6b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_670,&local_690,&local_6b0,0x196,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_690);
    boost::test_tools::assertion_result::~assertion_result(&local_670);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,4);
  local_6b4 = 4;
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::multiply_target_and_add(pvVar3,&local_6b4,pvVar4);
  local_718[9] = 0;
  local_718[8] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6f0,local_718 + 9,local_718 + 8);
  local_718[7] = 2;
  local_718[6] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6e8,local_718 + 7,local_718 + 6);
  local_718[5] = 3;
  local_718[4] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6e0,local_718 + 5,local_718 + 4);
  local_718[3] = 5;
  local_718[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_6d8,local_718 + 3,local_718 + 2);
  local_718[1] = 6;
  local_718[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_6d0,local_718 + 1,local_718);
  local_6c8 = &local_6f0;
  local_6c0 = 5;
  __l_06._M_len = 5;
  __l_06._M_array = local_6c8;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_06);
  local_748[4] = 0;
  local_748[5] = 2;
  local_748[6] = 1;
  local_748[0] = 3;
  local_748[1] = 0;
  local_748[2] = 1;
  local_748[3] = 2;
  local_728 = local_748;
  local_720 = 7;
  __l_05._M_len = 7;
  __l_05._M_array = local_728;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_05);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,4);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,3);
  local_74c = 3;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::multiply_source_and_add(pvVar3,pvVar4,&local_74c);
  local_7b0[9] = 0;
  local_7b0[8] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_788,local_7b0 + 9,local_7b0 + 8);
  local_7b0[7] = 1;
  local_7b0[6] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_780,local_7b0 + 7,local_7b0 + 6);
  local_7b0[5] = 2;
  local_7b0[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_778,local_7b0 + 5,local_7b0 + 4);
  local_7b0[3] = 5;
  local_7b0[2] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_770,local_7b0 + 3,local_7b0 + 2);
  local_7b0[1] = 6;
  local_7b0[0] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_768,local_7b0 + 1,local_7b0);
  local_760 = &local_788;
  local_758 = 5;
  __l_04._M_len = 5;
  __l_04._M_array = local_760;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_04);
  local_7e8[4] = 0;
  local_7e8[5] = 1;
  local_7e8[6] = 1;
  local_7e8[0] = 4;
  local_7e8[1] = 2;
  local_7e8[2] = 1;
  local_7e8[3] = 0;
  local_7c0 = local_7e8;
  local_7b8 = 7;
  __l_03._M_len = 7;
  __l_03._M_array = local_7c0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_03);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,4);
  local_7ec = 3;
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::multiply_source_and_add(pvVar3,pvVar4,&local_7ec);
  local_860[0xb] = 0;
  local_860[10] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_830,local_860 + 0xb,local_860 + 10);
  local_860[9] = 1;
  local_860[8] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_828,local_860 + 9,local_860 + 8);
  local_860[7] = 2;
  local_860[6] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_820,local_860 + 7,local_860 + 6);
  local_860[5] = 3;
  local_860[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_818,local_860 + 5,local_860 + 4);
  local_860[3] = 5;
  local_860[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_810,local_860 + 3,local_860 + 2);
  local_860[1] = 6;
  local_860[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_808,local_860 + 1,local_860);
  local_800 = &local_830;
  local_7f8 = 6;
  __l_02._M_len = 6;
  __l_02._M_array = local_800;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_02);
  local_898[4] = 0;
  local_898[5] = 2;
  local_898[6] = 4;
  local_898[0] = 3;
  local_898[1] = 2;
  local_898[2] = 4;
  local_898[3] = 1;
  local_870 = local_898;
  local_868 = 7;
  __l_01._M_len = 7;
  __l_01._M_array = local_870;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l_01);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,3);
  local_89c = 4;
  pvVar4 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,5);
  Gudhi::persistence_matrix::
  Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
  ::multiply_target_and_add(pvVar3,&local_89c,pvVar4);
  local_910[0xb] = 0;
  local_910[10] = 3;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8e0,local_910 + 0xb,local_910 + 10);
  local_910[9] = 1;
  local_910[8] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8d8,local_910 + 9,local_910 + 8);
  local_910[7] = 2;
  local_910[6] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8d0,local_910 + 7,local_910 + 6);
  local_910[5] = 3;
  local_910[4] = 1;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8c8,local_910 + 5,local_910 + 4);
  local_910[3] = 5;
  local_910[2] = 2;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>
            (&local_8c0,local_910 + 3,local_910 + 2);
  local_910[1] = 6;
  local_910[0] = 4;
  std::pair<unsigned_int,_unsigned_int>::pair<int,_int,_true>(&local_8b8,local_910 + 1,local_910);
  local_8b0 = &local_8e0;
  local_8a8 = 6;
  __l_00._M_len = 6;
  __l_00._M_array = local_8b0;
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::operator=((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,__l_00);
  local_948[4] = 0;
  local_948[5] = 2;
  local_948[6] = 4;
  local_948[0] = 3;
  local_948[1] = 2;
  local_948[2] = 4;
  local_948[3] = 1;
  local_920 = local_948;
  local_918 = 7;
  __l._M_len = 7;
  __l._M_array = local_920;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,__l);
  pvVar3 = std::
           vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
           ::operator[](matrix,3);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)1,true,true,true>>>,std::pair<unsigned_int,unsigned_int>>
            (pvVar3,(set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_958,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_968);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_958,0x1ac,&local_968);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_980,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9b0,"matrix[3] == matrix[5]",0x16);
    boost::unit_test::operator<<(&local_9a0,plVar5,&local_9b0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_980,&local_9a0,&local_9c0,0x1ac,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_9a0);
    boost::test_tools::assertion_result::~assertion_result(&local_980);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9d0,0x1ad,&local_9e0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,4);
    bVar2 = Gudhi::persistence_matrix::operator==(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_9f8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a28,"!(matrix[5] == matrix[4])",0x19);
    boost::unit_test::operator<<(&local_a18,plVar5,&local_a28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_9f8,&local_a18,&local_a38,0x1ad,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a18);
    boost::test_tools::assertion_result::~assertion_result(&local_9f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a58);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a48,0x1ae,&local_a58);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_a70,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_aa0,"!(matrix[5] < matrix[3])",0x18);
    boost::unit_test::operator<<(&local_a90,plVar5,&local_aa0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ab0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_a70,&local_a90,&local_ab0,0x1ae,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_a90);
    boost::test_tools::assertion_result::~assertion_result(&local_a70);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ac0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ad0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ac0,0x1af,&local_ad0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_ae8,(bool)(~bVar2 & 1));
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b18,"!(matrix[3] < matrix[5])",0x18);
    boost::unit_test::operator<<(&local_b08,plVar5,&local_b18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_ae8,&local_b08,&local_b28,0x1af,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b08);
    boost::test_tools::assertion_result::~assertion_result(&local_ae8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b38,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b48);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b38,0x1b4,&local_b48);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,5);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,4);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_b60,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b90,"matrix[5] < matrix[4]",0x15);
    boost::unit_test::operator<<(&local_b80,plVar5,&local_b90);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ba0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_b60,&local_b80,&local_ba0,0x1b4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_b80);
    boost::test_tools::assertion_result::~assertion_result(&local_b60);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bb0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bc0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bb0,0x1b5,&local_bc0);
    pvVar3 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,3);
    pvVar4 = std::
             vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>_>_>
             ::operator[](matrix,4);
    bVar2 = Gudhi::persistence_matrix::operator<(pvVar3,pvVar4);
    boost::test_tools::assertion_result::assertion_result(&local_bd8,bVar2);
    plVar5 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c08,"matrix[3] < matrix[4]",0x15);
    boost::unit_test::operator<<(&local_bf8,plVar5,&local_c08);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c18,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_bd8,&local_bf8,&local_c18,0x1b5,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_bf8);
    boost::test_tools::assertion_result::~assertion_result(&local_bd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::
  set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~set((set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *)&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void column_test_common_z5_operators(std::vector<Column>& matrix) {
  std::set<std::pair<unsigned int, typename Column::Field_element> > setcont;
  std::vector<typename Column::Field_element> veccont;

  matrix[0] += matrix[1];
  matrix[1] += matrix[2];

  setcont = {{1, 4}, {2, 1}, {3, 3}, {6, 1}};
  veccont = {0, 4, 1, 3, 0, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  matrix[0] *= 4;
  matrix[1] *= 2;
  matrix[2] *= 1;

  setcont = {{1, 1}, {2, 4}, {3, 2}, {6, 4}};
  veccont = {0, 1, 4, 2, 0, 0, 4};
  column_test_common_content_access(matrix[0], setcont, veccont);
  setcont = {{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}};
  veccont = {1, 3, 4, 0, 0, 4, 4};
  column_test_common_content_access(matrix[2], setcont, veccont);
  BOOST_CHECK(matrix[1] == matrix[1]);
  BOOST_CHECK(matrix[1] == matrix[3]);
  BOOST_CHECK(matrix[1] < matrix[0]);
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[0] < matrix[2]);  // order different for heap columns
  } else {
    BOOST_CHECK(matrix[2] < matrix[0]);
  }
  BOOST_CHECK(!(matrix[0] < matrix[0]));

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, matrix[5]);
  setcont = {{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}};
  veccont = {3, 0, 1, 2, 0, 2, 1};
  column_test_common_content_access(matrix[4], setcont, veccont);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[3], 3);
  setcont = {{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}};
  veccont = {4, 2, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = this + column * v
  matrix[5].multiply_source_and_add(matrix[4], 3);
  setcont = {{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}};
  veccont = {3, 2, 4, 1, 0, 2, 4};
  column_test_common_content_access(matrix[5], setcont, veccont);
  // this = v * this + column
  matrix[3].multiply_target_and_add(4, matrix[5]);
  setcont = {{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}};
  veccont = {3, 2, 4, 1, 0, 2, 4};
  column_test_common_content_access(matrix[3], setcont, veccont);
  BOOST_CHECK(matrix[3] == matrix[5]);
  BOOST_CHECK(!(matrix[5] == matrix[4]));
  BOOST_CHECK(!(matrix[5] < matrix[3]));
  BOOST_CHECK(!(matrix[3] < matrix[5]));
  if constexpr (Column::Master::Option_list::column_type == Column_types::HEAP) {
    BOOST_CHECK(matrix[4] < matrix[5]);
    BOOST_CHECK(matrix[4] < matrix[3]);
  } else {
    BOOST_CHECK(matrix[5] < matrix[4]);
    BOOST_CHECK(matrix[3] < matrix[4]);
  }
}